

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_context.hpp
# Opt level: O0

relationship_t __thiscall
asio::io_context::basic_executor_type<std::allocator<void>,_0UL>::query
          (basic_executor_type<std::allocator<void>,_0UL> *this,relationship_t param_2)

{
  uintptr_t uVar1;
  basic_executor_type<std::allocator<void>,_0UL> *in_RDI;
  relationship_t<0> local_4;
  
  uVar1 = bits(in_RDI);
  if ((uVar1 & 2) == 0) {
    execution::detail::relationship_t<0>::relationship_t(&local_4);
  }
  else {
    execution::detail::relationship_t<0>::relationship_t(&local_4);
  }
  return (relationship_t)local_4.value_;
}

Assistant:

constexpr execution::relationship_t query(
      execution::relationship_t) const noexcept
  {
    return (bits() & relationship_continuation)
      ? execution::relationship_t(execution::relationship.continuation)
      : execution::relationship_t(execution::relationship.fork);
  }